

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

iterator __thiscall
eastl::vector<eastl::pair<char,_int>,_eastl::allocator>::erase
          (vector<eastl::pair<char,_int>,_eastl::allocator> *this,iterator first,iterator last)

{
  pair<char,_int> **pppVar1;
  pair<char,_int> *ppVar2;
  long lVar3;
  
  ppVar2 = (this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd;
  for (lVar3 = 0; (pair<char,_int> *)(&last->first + lVar3) != ppVar2; lVar3 = lVar3 + 8) {
    *(pair<char,_int> *)(&first->first + lVar3) = *(pair<char,_int> *)(&last->first + lVar3);
  }
  pppVar1 = &(this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd;
  *pppVar1 = (pair<char,_int> *)((long)*pppVar1 + ((long)first - (long)last));
  return first;
}

Assistant:

inline typename vector<T, Allocator>::iterator
    vector<T, Allocator>::erase(iterator first, iterator last)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((first < mpBegin) || (first > mpEnd) || (last < mpBegin) || (last > mpEnd) || (last < first)))
                EASTL_FAIL_MSG("vector::erase -- invalid position");
#endif
 
        //#if 0 
            // Reference implementation, known to be correct:
            iterator const position = eastl::copy(last, mpEnd, first);
            DoDestroyValues(position, mpEnd);
            mpEnd -= (last - first);
        //#else 
        //    To do: Test this.
        //    // Implementation that has an optimization for memcpy which eastl::copy cannot do (the best it can do is memmove).
        //    iterator position;
        //    T* const pEnd = mpEnd - (last - first);
        //
        //    if((pEnd <= last) && eastl::has_trivial_assign<value_type>::value) // If doing a non-overlapping copy and the data is memcpy-able
        //    {
        //        const size_t size = (size_t)((uintptr_t)mpEnd-(uintptr_t)last);
        //        position = (T*)((uintptr_t)memcpy(first, last, size) + size);
        //    }
        //    else
        //        position = eastl::copy(last, mpEnd, first);
        //
        //    DoDestroyValues(position, mpEnd);
        //    mpEnd = pEnd;
        //#endif
 
        return first;
    }